

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

PendingComponent * __thiscall
cmComputeLinkDepends::MakePendingComponent(cmComputeLinkDepends *this,size_t component)

{
  NodeList *nl;
  long lVar1;
  mapped_type *pmVar2;
  size_t sVar3;
  pointer puVar4;
  pointer __v;
  _Alloc_node __an;
  _Alloc_node local_38;
  
  pmVar2 = std::
           map<unsigned_long,_cmComputeLinkDepends::PendingComponent,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::PendingComponent>_>_>
           ::operator[](&this->PendingComponents,
                        (this->ComponentOrder).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start + component);
  pmVar2->Id = component;
  lVar1 = *(long *)&(((this->CCG)._M_t.
                      super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
                      .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl)->
                    Components).
                    super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl;
  __v = *(pointer *)(lVar1 + component * 0x18);
  puVar4 = *(pointer *)(lVar1 + 8 + component * 0x18);
  sVar3 = 1;
  if ((long)puVar4 - (long)__v != 8) {
    nl = (NodeList *)(lVar1 + component * 0x18);
    sVar3 = ComputeComponentCount(this,nl);
    __v = (nl->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start;
    puVar4 = (nl->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  pmVar2->Count = sVar3;
  if (__v != puVar4) {
    local_38._M_t = &(pmVar2->Entries)._M_t;
    do {
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::
      _M_insert_unique_<unsigned_long_const&,std::_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>::_Alloc_node>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&pmVar2->Entries,
                 (const_iterator)&(pmVar2->Entries)._M_t._M_impl.super__Rb_tree_header,__v,&local_38
                );
      __v = __v + 1;
    } while (__v != puVar4);
  }
  return pmVar2;
}

Assistant:

cmComputeLinkDepends::PendingComponent&
cmComputeLinkDepends::MakePendingComponent(size_t component)
{
  // Create an entry (in topological order) for the component.
  PendingComponent& pc =
    this->PendingComponents[this->ComponentOrder[component]];
  pc.Id = component;
  NodeList const& nl = this->CCG->GetComponent(component);

  if (nl.size() == 1) {
    // Trivial components need be seen only once.
    pc.Count = 1;
  } else {
    // This is a non-trivial strongly connected component of the
    // original graph.  It consists of two or more libraries
    // (archives) that mutually require objects from one another.  In
    // the worst case we may have to repeat the list of libraries as
    // many times as there are object files in the biggest archive.
    // For now we just list them twice.
    //
    // The list of items in the component has been sorted by the order
    // of discovery in the original BFS of dependencies.  This has the
    // advantage that the item directly linked by a target requiring
    // this component will come first which minimizes the number of
    // repeats needed.
    pc.Count = this->ComputeComponentCount(nl);
  }

  // Store the entries to be seen.
  pc.Entries.insert(nl.begin(), nl.end());

  return pc;
}